

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadPerspectiveCamera(XMLLoader *this,Ref<embree::XML> *xml)

{
  _func_int **pp_Var1;
  undefined8 *in_RDX;
  Node *in_RDI;
  float fov_00;
  float fov;
  Vec3fa up;
  Vec3fa to;
  Vec3fa from;
  Vec3fa *up_00;
  allocator *to_00;
  Vec3fa *from_00;
  PerspectiveCameraNode *this_00;
  allocator local_131;
  string local_130 [32];
  float local_110;
  allocator<char> local_109;
  string local_108 [16];
  string *in_stack_ffffffffffffff08;
  XML *in_stack_ffffffffffffff10;
  allocator local_c9;
  string local_c8 [16];
  string *in_stack_ffffffffffffff48;
  XML *in_stack_ffffffffffffff50;
  allocator local_79;
  string local_78 [48];
  undefined8 *local_48;
  undefined8 *local_30;
  undefined8 *local_28;
  undefined8 *local_20;
  _func_int **local_10;
  
  local_48 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"from",&local_79);
  XML::parm_Vec3fa(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  local_20 = local_48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"to",&local_c9);
  XML::parm_Vec3fa(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  local_28 = local_48;
  from_00 = (Vec3fa *)*local_48;
  this_00 = (PerspectiveCameraNode *)&local_109;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"up",(allocator *)this_00);
  XML::parm_Vec3fa(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  local_30 = local_48;
  up_00 = (Vec3fa *)*local_48;
  to_00 = &local_131;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"fov",to_00);
  fov_00 = XML::parm_float(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  local_110 = fov_00;
  pp_Var1 = (_func_int **)SceneGraph::PerspectiveCameraNode::operator_new(0x387c60);
  SceneGraph::PerspectiveCameraNode::PerspectiveCameraNode
            (this_00,from_00,(Vec3fa *)to_00,up_00,fov_00);
  (in_RDI->super_RefCount)._vptr_RefCount = pp_Var1;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    local_10 = pp_Var1;
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadPerspectiveCamera(const Ref<XML>& xml) 
  {
    const Vec3fa from = xml->parm_Vec3fa("from");
    const Vec3fa to = xml->parm_Vec3fa("to");
    const Vec3fa up = xml->parm_Vec3fa("up");
    const float fov = xml->parm_float("fov");
    return new SceneGraph::PerspectiveCameraNode(from,to,up,fov);
  }